

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O0

void __thiscall
glsl_type::glsl_type
          (glsl_type *this,GLenum gl_type,glsl_base_type base_type,uint vector_elements,
          uint matrix_columns,char *name,uint explicit_stride,bool row_major)

{
  void *pvVar1;
  char *pcVar2;
  undefined1 local_c0 [8];
  glsl_type s_2;
  glsl_type s_1;
  glsl_type s;
  bool row_major_local;
  char *name_local;
  uint matrix_columns_local;
  uint vector_elements_local;
  glsl_base_type base_type_local;
  GLenum gl_type_local;
  glsl_type *this_local;
  
  this->gl_type = gl_type;
  *(glsl_base_type *)&this->field_0x4 =
       *(glsl_base_type *)&this->field_0x4 & 0xffffff00 | base_type & 0xff;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0xffff00ff | 0x1200;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0xfff0ffff;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0xffefffff;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0xffdfffff;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0xff3fffff;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0xfeffffff | (uint)row_major << 0x18;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0xfdffffff;
  this->vector_elements = (uint8_t)vector_elements;
  this->matrix_columns = (uint8_t)matrix_columns;
  this->length = 0;
  this->explicit_stride = explicit_stride;
  glsl_type((glsl_type *)&s_1.mem_ctx);
  s_1.mem_ctx._4_4_ = s_1.mem_ctx._4_4_ & 0xffffff00 | 0x15;
  ~glsl_type((glsl_type *)&s_1.mem_ctx);
  glsl_type((glsl_type *)&s_2.mem_ctx);
  s_2.mem_ctx._4_4_ = s_2.mem_ctx._4_4_ & 0xffff00ff | 0x1500;
  ~glsl_type((glsl_type *)&s_2.mem_ctx);
  glsl_type((glsl_type *)local_c0);
  local_c0._4_4_ = local_c0._4_4_ & 0xfff0ffff | 0x90000;
  ~glsl_type((glsl_type *)local_c0);
  pvVar1 = ralloc_context((void *)0x0);
  this->mem_ctx = pvVar1;
  if (this->mem_ctx == (void *)0x0) {
    __assert_fail("this->mem_ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                  ,0x46,
                  "glsl_type::glsl_type(GLenum, glsl_base_type, unsigned int, unsigned int, const char *, unsigned int, bool)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                  ,0x48,
                  "glsl_type::glsl_type(GLenum, glsl_base_type, unsigned int, unsigned int, const char *, unsigned int, bool)"
                 );
  }
  pcVar2 = ralloc_strdup(this->mem_ctx,name);
  this->name = pcVar2;
  if ((vector_elements == 0) != (matrix_columns == 0)) {
    __assert_fail("(vector_elements == 0) == (matrix_columns == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                  ,0x4d,
                  "glsl_type::glsl_type(GLenum, glsl_base_type, unsigned int, unsigned int, const char *, unsigned int, bool)"
                 );
  }
  memset(&this->fields,0,8);
  return;
}

Assistant:

glsl_type::glsl_type(GLenum gl_type,
                     glsl_base_type base_type, unsigned vector_elements,
                     unsigned matrix_columns, const char *name,
                     unsigned explicit_stride, bool row_major) :
   gl_type(gl_type),
   base_type(base_type), sampled_type(GLSL_TYPE_VOID),
   sampler_dimensionality(0), sampler_shadow(0), sampler_array(0),
   interface_packing(0), interface_row_major(row_major), packed(0),
   vector_elements(vector_elements), matrix_columns(matrix_columns),
   length(0), explicit_stride(explicit_stride)
{
   /* Values of these types must fit in the two bits of
    * glsl_type::sampled_type.
    */
   STATIC_ASSERT((unsigned(GLSL_TYPE_UINT)  & 3) == unsigned(GLSL_TYPE_UINT));
   STATIC_ASSERT((unsigned(GLSL_TYPE_INT)   & 3) == unsigned(GLSL_TYPE_INT));
   STATIC_ASSERT((unsigned(GLSL_TYPE_FLOAT) & 3) == unsigned(GLSL_TYPE_FLOAT));

   ASSERT_BITFIELD_SIZE(glsl_type, base_type, GLSL_TYPE_ERROR);
   ASSERT_BITFIELD_SIZE(glsl_type, sampled_type, GLSL_TYPE_ERROR);
   ASSERT_BITFIELD_SIZE(glsl_type, sampler_dimensionality,
                        GLSL_SAMPLER_DIM_SUBPASS_MS);

   this->mem_ctx = ralloc_context(NULL);
   assert(this->mem_ctx != NULL);

   assert(name != NULL);
   this->name = ralloc_strdup(this->mem_ctx, name);

   /* Neither dimension is zero or both dimensions are zero.
    */
   assert((vector_elements == 0) == (matrix_columns == 0));
   memset(& fields, 0, sizeof(fields));
}